

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O2

SRes SzGetNextFolderItem(CSzFolder *f,CSzData *sd)

{
  byte bVar1;
  Byte BVar2;
  uint uVar3;
  Byte *pBVar4;
  Byte *pBVar5;
  SRes SVar6;
  Byte aBVar7 [4];
  size_t sVar8;
  byte *pbVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  CSzCoderInfo *pCVar14;
  ulong uVar15;
  Byte aBVar16 [4];
  UInt32 *value;
  bool bVar17;
  UInt32 numStreams;
  Byte coderUsed [4];
  UInt32 numCoders;
  ulong uVar13;
  
  pBVar4 = sd->Data;
  f->NumCoders = 0;
  f->NumBonds = 0;
  f->NumPackStreams = 0;
  f->UnpackStream = 0;
  SVar6 = SzReadNumber32(sd,&numCoders);
  if (SVar6 != 0) {
    return SVar6;
  }
  if (numCoders - 5 < 0xfffffffc) {
    return 4;
  }
  aBVar16[0] = '\0';
  aBVar16[1] = '\0';
  aBVar16[2] = '\0';
  aBVar16[3] = '\0';
  for (uVar10 = 0; (UInt32)uVar10 != numCoders; uVar10 = (ulong)((UInt32)uVar10 + 1)) {
    sVar8 = sd->Size;
    if (sVar8 == 0) {
      return 0x10;
    }
    sd->Size = sVar8 - 1;
    pbVar9 = sd->Data;
    sd->Data = pbVar9 + 1;
    bVar1 = *pbVar9;
    if (0x3f < bVar1) {
      return 4;
    }
    uVar11 = bVar1 & 0xf;
    uVar13 = (ulong)uVar11;
    if (8 < uVar11) {
      return 4;
    }
    if (sVar8 - 1 < uVar13) {
      return 0x10;
    }
    pCVar14 = f->Coders + uVar10;
    sVar8 = sVar8 - 2;
    pbVar9 = pbVar9 + 2;
    uVar15 = 0;
    while (iVar12 = (int)uVar13, uVar13 = (ulong)(iVar12 - 1), iVar12 != 0) {
      uVar15 = uVar15 << 8 | (ulong)pbVar9[-1];
      sd->Data = pbVar9;
      sd->Size = sVar8;
      sVar8 = sVar8 - 1;
      pbVar9 = pbVar9 + 1;
    }
    if (uVar15 >> 0x20 != 0) {
      return 4;
    }
    pCVar14->MethodID = (UInt32)uVar15;
    pCVar14->NumStreams = '\x01';
    pCVar14->PropsSize = '\0';
    pCVar14->PropsOffset = 0;
    uVar11 = 1;
    if ((bVar1 & 0x10) != 0) {
      SVar6 = SzReadNumber32(sd,&numStreams);
      if (SVar6 != 0) {
        return SVar6;
      }
      if (7 < numStreams) {
        return 4;
      }
      pCVar14->NumStreams = (Byte)numStreams;
      SVar6 = SzReadNumber32(sd,&numStreams);
      if (SVar6 != 0) {
        return SVar6;
      }
      if (numStreams != 1) {
        return 4;
      }
      uVar11 = (uint)pCVar14->NumStreams;
    }
    aBVar16 = (Byte  [4])((int)aBVar16 + uVar11);
    if (7 < (uint)aBVar16) {
      return 4;
    }
    if (0x1f < bVar1) {
      numStreams = 0;
      SVar6 = SzReadNumber32(sd,&numStreams);
      if (SVar6 != 0) {
        return SVar6;
      }
      uVar15 = (ulong)numStreams;
      uVar13 = sd->Size;
      if (uVar13 < uVar15) {
        return 0x10;
      }
      if (0x7f < numStreams) {
        return 4;
      }
      pBVar5 = sd->Data;
      pCVar14->PropsOffset = (long)pBVar5 - (long)pBVar4;
      pCVar14->PropsSize = (Byte)numStreams;
      sd->Data = pBVar5 + uVar15;
      sd->Size = uVar13 - uVar15;
    }
  }
  aBVar7 = (Byte  [4])(numCoders - 1);
  uVar11 = (int)aBVar16 - (int)aBVar7;
  if ((uint)aBVar7 <= (uint)aBVar16) {
    if (3 < (uint)aBVar7) {
      return 4;
    }
    f->NumBonds = (UInt32)aBVar7;
    if (4 < uVar11) {
      return 4;
    }
    f->NumPackStreams = uVar11;
    for (uVar10 = 0; (uint)aBVar16 != uVar10; uVar10 = uVar10 + 1) {
      *(undefined1 *)((long)&numStreams + uVar10) = 0;
    }
    if (aBVar7 != (Byte  [4])0x0) {
      for (uVar10 = 0; numCoders != uVar10; uVar10 = uVar10 + 1) {
        coderUsed[uVar10] = '\0';
      }
      uVar10 = (ulong)(uint)aBVar7;
      value = &f->Bonds[0].OutIndex;
      while (bVar17 = uVar10 != 0, uVar10 = uVar10 - 1, bVar17) {
        SVar6 = SzReadNumber32(sd,value + -1);
        if (SVar6 != 0) {
          return SVar6;
        }
        aBVar7 = (Byte  [4])((CSzBond *)(value + -1))->InIndex;
        if ((uint)aBVar16 <= (uint)aBVar7) {
          return 0x10;
        }
        if (*(char *)((long)&numStreams + (ulong)(uint)aBVar7) != '\0') {
          return 0x10;
        }
        *(undefined1 *)((long)&numStreams + (ulong)(uint)aBVar7) = 1;
        SVar6 = SzReadNumber32(sd,value);
        if (SVar6 != 0) {
          return SVar6;
        }
        uVar3 = *value;
        if (numCoders <= uVar3) {
          return 0x10;
        }
        BVar2 = coderUsed[uVar3];
        value = value + 2;
        coderUsed[uVar3] = BVar2 + (BVar2 == '\0');
        if (BVar2 != '\0') {
          return 0x10;
        }
      }
      uVar10 = 0;
      while( true ) {
        if (numCoders == uVar10) {
          return 0x10;
        }
        if (coderUsed[uVar10] == '\0') break;
        uVar10 = uVar10 + 1;
      }
      f->UnpackStream = (UInt32)uVar10;
      if (numCoders == (UInt32)uVar10) {
        return 0x10;
      }
    }
    if (uVar11 != 1) {
      for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
        SVar6 = SzReadNumber32(sd,(UInt32 *)coderUsed);
        aBVar7 = coderUsed;
        if (SVar6 != 0) {
          return SVar6;
        }
        if ((uint)aBVar16 <= (uint)coderUsed) {
          return 0x10;
        }
        if (*(char *)((long)&numStreams + (ulong)(uint)coderUsed) != '\0') {
          return 0x10;
        }
        *(undefined1 *)((long)&numStreams + (ulong)(uint)coderUsed) = 1;
        f->PackStreams[uVar10] = (UInt32)aBVar7;
      }
LAB_005999a6:
      f->NumCoders = numCoders;
      return 0;
    }
    for (uVar10 = 0; (uint)aBVar16 != uVar10; uVar10 = uVar10 + 1) {
      if (*(char *)((long)&numStreams + uVar10) == '\0') {
        if (aBVar16 == SUB84(uVar10,0)) {
          return 0x10;
        }
        f->PackStreams[0] = (UInt32)SUB84(uVar10,0);
        goto LAB_005999a6;
      }
    }
  }
  return 0x10;
}

Assistant:

SRes SzGetNextFolderItem(CSzFolder *f, CSzData *sd)
{
  UInt32 numCoders, i;
  UInt32 numInStreams = 0;
  const Byte *dataStart = sd->Data;

  f->NumCoders = 0;
  f->NumBonds = 0;
  f->NumPackStreams = 0;
  f->UnpackStream = 0;
  
  RINOK(SzReadNumber32(sd, &numCoders));
  if (numCoders == 0 || numCoders > SZ_NUM_CODERS_IN_FOLDER_MAX)
    return SZ_ERROR_UNSUPPORTED;
  
  for (i = 0; i < numCoders; i++)
  {
    Byte mainByte;
    CSzCoderInfo *coder = f->Coders + i;
    unsigned idSize, j;
    UInt64 id;
    
    SZ_READ_BYTE(mainByte);
    if ((mainByte & 0xC0) != 0)
      return SZ_ERROR_UNSUPPORTED;
    
    idSize = (unsigned)(mainByte & 0xF);
    if (idSize > sizeof(id))
      return SZ_ERROR_UNSUPPORTED;
    if (idSize > sd->Size)
      return SZ_ERROR_ARCHIVE;
    id = 0;
    for (j = 0; j < idSize; j++)
    {
      id = ((id << 8) | *sd->Data);
      sd->Data++;
      sd->Size--;
    }
    if (id > (UInt32)0xFFFFFFFF)
      return SZ_ERROR_UNSUPPORTED;
    coder->MethodID = (UInt32)id;
    
    coder->NumStreams = 1;
    coder->PropsOffset = 0;
    coder->PropsSize = 0;
    
    if ((mainByte & 0x10) != 0)
    {
      UInt32 numStreams;
      
      RINOK(SzReadNumber32(sd, &numStreams));
      if (numStreams > k_NumCodersStreams_in_Folder_MAX)
        return SZ_ERROR_UNSUPPORTED;
      coder->NumStreams = (Byte)numStreams;

      RINOK(SzReadNumber32(sd, &numStreams));
      if (numStreams != 1)
        return SZ_ERROR_UNSUPPORTED;
    }

    numInStreams += coder->NumStreams;

    if (numInStreams > k_NumCodersStreams_in_Folder_MAX)
      return SZ_ERROR_UNSUPPORTED;

    if ((mainByte & 0x20) != 0)
    {
      UInt32 propsSize = 0;
      RINOK(SzReadNumber32(sd, &propsSize));
      if (propsSize > sd->Size)
        return SZ_ERROR_ARCHIVE;
      if (propsSize >= 0x80)
        return SZ_ERROR_UNSUPPORTED;
      coder->PropsOffset = sd->Data - dataStart;
      coder->PropsSize = (Byte)propsSize;
      sd->Data += (size_t)propsSize;
      sd->Size -= (size_t)propsSize;
    }
  }

  /*
  if (numInStreams == 1 && numCoders == 1)
  {
    f->NumPackStreams = 1;
    f->PackStreams[0] = 0;
  }
  else
  */
  {
    Byte streamUsed[k_NumCodersStreams_in_Folder_MAX];
    UInt32 numBonds, numPackStreams;
    
    numBonds = numCoders - 1;
    if (numInStreams < numBonds)
      return SZ_ERROR_ARCHIVE;
    if (numBonds > SZ_NUM_BONDS_IN_FOLDER_MAX)
      return SZ_ERROR_UNSUPPORTED;
    f->NumBonds = numBonds;
    
    numPackStreams = numInStreams - numBonds;
    if (numPackStreams > SZ_NUM_PACK_STREAMS_IN_FOLDER_MAX)
      return SZ_ERROR_UNSUPPORTED;
    f->NumPackStreams = numPackStreams;
  
    for (i = 0; i < numInStreams; i++)
      streamUsed[i] = False;
    
    if (numBonds != 0)
    {
      Byte coderUsed[SZ_NUM_CODERS_IN_FOLDER_MAX];

      for (i = 0; i < numCoders; i++)
        coderUsed[i] = False;
      
      for (i = 0; i < numBonds; i++)
      {
        CSzBond *bp = f->Bonds + i;
        
        RINOK(SzReadNumber32(sd, &bp->InIndex));
        if (bp->InIndex >= numInStreams || streamUsed[bp->InIndex])
          return SZ_ERROR_ARCHIVE;
        streamUsed[bp->InIndex] = True;
        
        RINOK(SzReadNumber32(sd, &bp->OutIndex));
        if (bp->OutIndex >= numCoders || coderUsed[bp->OutIndex])
          return SZ_ERROR_ARCHIVE;
        coderUsed[bp->OutIndex] = True;
      }
      
      for (i = 0; i < numCoders; i++)
        if (!coderUsed[i])
        {
          f->UnpackStream = i;
          break;
        }
      
      if (i == numCoders)
        return SZ_ERROR_ARCHIVE;
    }
    
    if (numPackStreams == 1)
    {
      for (i = 0; i < numInStreams; i++)
        if (!streamUsed[i])
          break;
      if (i == numInStreams)
        return SZ_ERROR_ARCHIVE;
      f->PackStreams[0] = i;
    }
    else
      for (i = 0; i < numPackStreams; i++)
      {
        UInt32 index;
        RINOK(SzReadNumber32(sd, &index));
        if (index >= numInStreams || streamUsed[index])
          return SZ_ERROR_ARCHIVE;
        streamUsed[index] = True;
        f->PackStreams[i] = index;
      }
  }

  f->NumCoders = numCoders;

  return SZ_OK;
}